

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

LogDestination * google::LogDestination::log_destination(LogSeverity severity)

{
  bool bVar1;
  pointer pLVar2;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> local_18;
  LogSeverity local_c [2];
  LogSeverity severity_local;
  
  local_c[0] = severity;
  bVar1 = std::operator==((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                           *)(log_destinations_ + (ulong)severity * 8),(nullptr_t)0x0);
  if (bVar1) {
    std::make_unique<google::LogDestination,google::LogSeverity&,decltype(nullptr)>
              ((LogSeverity *)&local_18,(void **)local_c);
    std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::operator=
              ((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
               (log_destinations_ + (ulong)local_c[0] * 8),&local_18);
    std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    ~unique_ptr(&local_18);
  }
  pLVar2 = std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
           get((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
               (log_destinations_ + (ulong)local_c[0] * 8));
  return pLVar2;
}

Assistant:

inline LogDestination* LogDestination::log_destination(LogSeverity severity) {
  if (log_destinations_[severity] == nullptr) {
    log_destinations_[severity] =
        std::make_unique<LogDestination>(severity, nullptr);
  }
  return log_destinations_[severity].get();
}